

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O0

void __thiscall
pstore::region::region_builder<pstore::file::in_memory,_pstore::in_memory_mapper>::append
          (region_builder<pstore::file::in_memory,_pstore::in_memory_mapper> *this,
          not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
          regions,uint64_t offset,uint64_t bytes_to_map)

{
  bool bVar1;
  unsigned_long *puVar2;
  vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
  *regions_00;
  uint64_t size;
  uint64_t local_28;
  uint64_t bytes_to_map_local;
  uint64_t offset_local;
  region_builder<pstore::file::in_memory,_pstore::in_memory_mapper> *this_local;
  not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
  regions_local;
  
  size = 0;
  local_28 = bytes_to_map;
  bytes_to_map_local = offset;
  offset_local = (uint64_t)this;
  this_local = (region_builder<pstore::file::in_memory,_pstore::in_memory_mapper> *)regions.ptr_;
  bVar1 = gsl::
          not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
          ::operator!=((not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
                        *)&this_local,
                       (vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>
                        **)&size);
  if (!bVar1) {
    assert_failed("regions != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/region.hpp"
                  ,0x7c);
  }
  if (bytes_to_map_local % this->minimum_size_ != 0) {
    assert_failed("offset % minimum_size_ == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/region.hpp"
                  ,0x7d);
  }
  local_28 = round_up(local_28,this->minimum_size_);
  if (local_28 % this->minimum_size_ != 0) {
    assert_failed("bytes_to_map % minimum_size_ == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/core/region.hpp"
                  ,0x7f);
  }
  while (local_28 != 0) {
    puVar2 = std::min<unsigned_long>(&this->full_size_,&local_28);
    local_28 = local_28 - *puVar2;
    push(this,(not_null<std::vector<std::shared_ptr<pstore::memory_mapper_base>,_std::allocator<std::shared_ptr<pstore::memory_mapper_base>_>_>_*>
               )this_local,local_28,bytes_to_map_local,*puVar2);
    bytes_to_map_local = this->full_size_ + bytes_to_map_local;
  }
  regions_00 = gsl::not_null::operator_cast_to_vector_((not_null *)&this_local);
  check_regions_are_contiguous(this,regions_00);
  return;
}

Assistant:

void region_builder<File, MemoryMapper>::append (gsl::not_null<container_type *> regions,
                                                         std::uint64_t offset,
                                                         std::uint64_t bytes_to_map) {
            PSTORE_ASSERT (regions != nullptr);
            PSTORE_ASSERT (offset % minimum_size_ == 0);
            bytes_to_map = round_up (bytes_to_map, minimum_size_);
            PSTORE_ASSERT (bytes_to_map % minimum_size_ == 0);

            // Zero or more regions whose size is a multiple of minimum-size but no
            // more than full-size.
            while (bytes_to_map > 0) {
                // Map no more than "full size" in one go.
                std::uint64_t const size = std::min (full_size_, bytes_to_map);

                bytes_to_map -= size;
                this->push (regions, bytes_to_map,
                            offset, // start of region
                            size);  // size of region
                offset += full_size_;
            }
            this->check_regions_are_contiguous (*regions);
        }